

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O0

void operator_attack(op_type_conflict *op_pt)

{
  uint uVar1;
  uint local_18;
  Bit32u ct;
  Bit32u num_steps_add;
  op_type_conflict *op_pt_local;
  
  op_pt->amp = ((op_pt->a3 * op_pt->amp + op_pt->a2) * op_pt->amp + op_pt->a1) * op_pt->amp +
               op_pt->a0;
  uVar1 = op_pt->generator_pos >> 0x10;
  for (local_18 = 0; local_18 < uVar1; local_18 = local_18 + 1) {
    op_pt->cur_env_step = op_pt->cur_env_step + 1;
    if ((op_pt->cur_env_step & op_pt->env_step_a) == 0) {
      if (1.0 < op_pt->amp) {
        op_pt->op_state = 1;
        op_pt->amp = 1.0;
        op_pt->step_amp = 1.0;
      }
      op_pt->step_skip_pos_a = op_pt->step_skip_pos_a << 1;
      if (op_pt->step_skip_pos_a == '\0') {
        op_pt->step_skip_pos_a = '\x01';
      }
      if (((uint)op_pt->step_skip_pos_a & op_pt->env_step_skip_a) != 0) {
        op_pt->step_amp = op_pt->amp;
      }
    }
  }
  op_pt->generator_pos = op_pt->generator_pos + uVar1 * -0x10000;
  return;
}

Assistant:

static void operator_attack(op_type* op_pt)
{
	Bit32u num_steps_add;
	Bit32u ct;
	
	op_pt->amp = ((op_pt->a3*op_pt->amp + op_pt->a2)*op_pt->amp + op_pt->a1)*op_pt->amp + op_pt->a0;

	num_steps_add = op_pt->generator_pos/FIXEDPT;		// number of (standardized) samples
	for (ct=0; ct<num_steps_add; ct++)
	{
		op_pt->cur_env_step++;	// next sample
		if ((op_pt->cur_env_step & op_pt->env_step_a)==0)
		{		// check if next step already reached
			if (op_pt->amp > 1.0)
			{
				// attack phase finished, next: decay
				op_pt->op_state = OF_TYPE_DEC;
				op_pt->amp = 1.0;
				op_pt->step_amp = 1.0;
			}
			op_pt->step_skip_pos_a <<= 1;
			if (op_pt->step_skip_pos_a==0) op_pt->step_skip_pos_a = 1;
			if (op_pt->step_skip_pos_a & op_pt->env_step_skip_a)
			{	// check if required to skip next step
				op_pt->step_amp = op_pt->amp;
			}
		}
	}
	op_pt->generator_pos -= num_steps_add*FIXEDPT;
}